

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

event_process_result __thiscall
afsm::
state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::process_event_impl<afsm::test::events::terminate>
          (state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,terminate *event,process_type<actions::event_process_result::process> *sel)

{
  _Rb_tree_header *p_Var1;
  test_fsm_observer *ptVar2;
  event_process_result eVar3;
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  _Stack_48;
  
  ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
           super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptVar2 != (test_fsm_observer *)0x0) {
    test::test_fsm_observer::
    start_process_event<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::terminate>
              (ptVar2,this,event);
  }
  eVar3 = transitions::
          state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
          ::process_event<afsm::test::events::terminate>
                    ((state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                      *)&(this->
                         super_state_machine_base<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                         ).super_type.
                         super_state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                         .
                         super_transition_container<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                     ,event);
  switch(eVar3) {
  case refuse:
    ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
             super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (ptVar2 != (test_fsm_observer *)0x0) {
      test::test_fsm_observer::
      reject_event<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::terminate>
                (ptVar2,this,event);
    }
    break;
  case defer:
    defer_event<afsm::test::events::terminate>(this,event);
    break;
  case process_in_state:
    ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
             super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (ptVar2 != (test_fsm_observer *)0x0) {
      test::test_fsm_observer::
      processed_in_state<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::terminate>
                (ptVar2,this,event);
    }
    break;
  case process:
    detail::
    state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
    ::current_handled_events
              ((event_set *)&_Stack_48,
               (state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                *)this);
    std::
    _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::clear(&(this->handled_)._M_t);
    if (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &_Stack_48._M_impl.super__Rb_tree_header;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_48._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_48._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::~_Rb_tree(&_Stack_48);
    detail::
    state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
    ::current_deferrable_events
              ((event_set *)&_Stack_48,
               (state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                *)this);
    std::
    _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::clear(&(this->deferred_)._M_t);
    if (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &_Stack_48._M_impl.super__Rb_tree_header;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_48._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_48._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::~_Rb_tree(&_Stack_48);
    process_deferred_queue(this);
  }
  return eVar3;
}

Assistant:

actions::event_process_result
    process_event_impl(Event&& event,
        detail::process_type<actions::event_process_result::process> const& sel)
    {
        using actions::event_process_result;
        observer_wrapper::start_process_event(*this, ::std::forward<Event>(event));
        auto res = base_machine_type::process_event_impl(*this, ::std::forward<Event>(event), sel );
        switch (res) {
            case event_process_result::process:
                // Changed state. Process deferred events
                handled_    = base_machine_type::current_handled_events();
                deferred_   = base_machine_type::current_deferrable_events();
                process_deferred_queue();
                break;
            case event_process_result::process_in_state:
                observer_wrapper::processed_in_state(*this, ::std::forward<Event>(event));
                break;
            case event_process_result::defer:
                // Add event to deferred queue
                defer_event(::std::forward<Event>(event));
                break;
            case event_process_result::refuse:
                // The event cannot be processed in current state
                observer_wrapper::reject_event(*this, ::std::forward<Event>(event));
                return reject_event_impl(::std::forward<Event>(event),
                        ::std::integral_constant<bool,
                        actions::detail::handles_reject<T, Event>::value>{});
            default:
                break;
        }
        return res;
    }